

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DashTests.cpp
# Opt level: O1

void __thiscall
agge::tests::DashTests::ClosedPolygonProducesDashesForTheClosingSegment(DashTests *this)

{
  undefined8 uVar1;
  long lVar2;
  undefined8 *puVar3;
  point *ppVar4;
  byte bVar5;
  dash d;
  point reference [10];
  dash local_1b0;
  point local_158 [10];
  point local_d8;
  point local_cc;
  point local_c0;
  point local_b4;
  point local_a8;
  point local_9c;
  point local_90;
  point local_84;
  point local_78;
  point local_6c;
  string local_58;
  LocationInfo local_38;
  
  bVar5 = 0;
  dash::dash(&local_1b0);
  dash::add_dash(&local_1b0,2.0,1.0);
  dash::add_vertex(&local_1b0,-2.0,2.0,1);
  dash::add_vertex(&local_1b0,-2.0,-1.0,2);
  dash::add_vertex(&local_1b0,2.0,-1.0,2);
  dash::add_vertex(&local_1b0,0.0,0.0,0x30);
  local_158[0].command = 0;
  local_158[0].x = 0.0;
  local_158[0].y = 0.0;
  local_d8.command = dash::vertex(&local_1b0,&local_158[0].x,&local_158[0].y);
  local_d8.x = local_158[0].x;
  local_d8.y = local_158[0].y;
  local_158[0].command = 0;
  local_158[0].x = 0.0;
  local_158[0].y = 0.0;
  local_cc.command = dash::vertex(&local_1b0,&local_158[0].x,&local_158[0].y);
  local_cc.x = local_158[0].x;
  local_cc.y = local_158[0].y;
  local_158[0].command = 0;
  local_158[0].x = 0.0;
  local_158[0].y = 0.0;
  local_c0.command = dash::vertex(&local_1b0,&local_158[0].x,&local_158[0].y);
  local_c0.x = local_158[0].x;
  local_c0.y = local_158[0].y;
  local_158[0].command = 0;
  local_158[0].x = 0.0;
  local_158[0].y = 0.0;
  local_b4.command = dash::vertex(&local_1b0,&local_158[0].x,&local_158[0].y);
  local_b4.x = local_158[0].x;
  local_b4.y = local_158[0].y;
  local_158[0].command = 0;
  local_158[0].x = 0.0;
  local_158[0].y = 0.0;
  local_a8.command = dash::vertex(&local_1b0,&local_158[0].x,&local_158[0].y);
  local_a8.x = local_158[0].x;
  local_a8.y = local_158[0].y;
  local_158[0].command = 0;
  local_158[0].x = 0.0;
  local_158[0].y = 0.0;
  local_9c.command = dash::vertex(&local_1b0,&local_158[0].x,&local_158[0].y);
  local_9c.x = local_158[0].x;
  local_9c.y = local_158[0].y;
  local_158[0].command = 0;
  local_158[0].x = 0.0;
  local_158[0].y = 0.0;
  local_90.command = dash::vertex(&local_1b0,&local_158[0].x,&local_158[0].y);
  local_90.x = local_158[0].x;
  local_90.y = local_158[0].y;
  local_158[0].command = 0;
  local_158[0].x = 0.0;
  local_158[0].y = 0.0;
  local_84.command = dash::vertex(&local_1b0,&local_158[0].x,&local_158[0].y);
  local_84.x = local_158[0].x;
  local_84.y = local_158[0].y;
  local_158[0].command = 0;
  local_158[0].x = 0.0;
  local_158[0].y = 0.0;
  local_78.command = dash::vertex(&local_1b0,&local_158[0].x,&local_158[0].y);
  local_78.x = local_158[0].x;
  local_78.y = local_158[0].y;
  local_158[0].command = 0;
  local_158[0].x = 0.0;
  local_158[0].y = 0.0;
  local_6c.command = dash::vertex(&local_1b0,&local_158[0].x,&local_158[0].y);
  local_6c.x = local_158[0].x;
  local_6c.y = local_158[0].y;
  puVar3 = &DAT_0019eb10;
  ppVar4 = local_158;
  for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
    uVar1 = *puVar3;
    ppVar4->x = (real_t)(int)uVar1;
    ppVar4->y = (real_t)(int)((ulong)uVar1 >> 0x20);
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    ppVar4 = (point *)((long)ppVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_38,&local_58,300);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,10ul>
            (&local_158,(point (*) [10])&local_d8,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.filename._M_dataplus._M_p != &local_38.filename.field_2) {
    operator_delete(local_38.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_1b0._pattern._begin != (dash_gap *)0x0) {
    operator_delete__(local_1b0._pattern._begin);
  }
  if (local_1b0.super_vertex_sequence.super_pod_vector<agge::vertex>._begin != (vertex *)0x0) {
    operator_delete__(local_1b0.super_vertex_sequence.super_pod_vector<agge::vertex>._begin);
  }
  return;
}

Assistant:

test( ClosedPolygonProducesDashesForTheClosingSegment )
			{
				// INIT
				dash d;

				d.add_dash(2.0f, 1.0f);

				// ACT
				move_to(d, -2.0f, 2.0f);
				line_to(d, -2.0f, -1.0f);
				line_to(d, 2.0f, -1.0f);
				end_poly(d, true);

				mocks::path::point result[] = {
					vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d), vertex(d), vertex(d),
					vertex(d), vertex(d),
					vertex(d),
				};

				// ASSERT
				mocks::path::point reference[] = {
					{ -2.0f, 2.0f, path_command_move_to }, { -2.0f, 0.0f, path_command_line_to },
					{ -2.0f, -1.0f, path_command_move_to }, { 0.0f, -1.0f, path_command_line_to },
					{ 1.0f, -1.0f, path_command_move_to }, { 2.0f, -1.0f, path_command_line_to }, { 1.2f, -0.4f, path_command_line_to },
					{ 0.4f, 0.2f, path_command_move_to }, { -1.2f, 1.4f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference, result);
			}